

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderText(ImVec2 pos,char *text,char *text_end,bool hide_text_after_hash)

{
  float font_size;
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImFont *font;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiContext *pIVar4;
  ImU32 col;
  char *pcVar5;
  size_t sVar6;
  undefined7 in_register_00000011;
  char *text_end_00;
  ImGuiContext *g;
  char *pcVar7;
  char *pcVar8;
  ImVec2 local_40;
  ImVec4 local_38;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  local_40 = pos;
  if ((int)CONCAT71(in_register_00000011,hide_text_after_hash) == 0) {
    pcVar8 = text_end;
    if (text_end == (char *)0x0) {
      sVar6 = strlen(text);
      pcVar8 = text + sVar6;
    }
  }
  else {
    pcVar5 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
    pcVar8 = text;
    pcVar7 = text;
    if (text < pcVar5) {
      do {
        pcVar8 = pcVar7;
        if (*pcVar7 == '#') {
          if (pcVar7[1] == '#') break;
        }
        else if (*pcVar7 == '\0') break;
        pcVar7 = pcVar7 + 1;
        pcVar8 = pcVar5;
      } while (pcVar7 != pcVar5);
    }
  }
  if (0 < (int)pcVar8 - (int)text) {
    this = pIVar1->DrawList;
    font = pIVar4->Font;
    font_size = pIVar4->FontSize;
    local_38.x = (pIVar4->Style).Colors[0].x;
    local_38.y = (pIVar4->Style).Colors[0].y;
    uVar2 = (pIVar4->Style).Colors[0].z;
    uVar3 = (pIVar4->Style).Colors[0].w;
    local_38.w = (pIVar4->Style).Alpha * (float)uVar3;
    local_38.z = (float)uVar2;
    col = ColorConvertFloat4ToU32(&local_38);
    ImDrawList::AddText(this,font,font_size,&local_40,col,text,pcVar8,0.0,(ImVec4 *)0x0);
    if (pIVar4->LogEnabled == true) {
      LogRenderedText((ImVec2 *)text,pcVar8,text_end_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::RenderText(ImVec2 pos, const char* text, const char* text_end, bool hide_text_after_hash)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Hide anything after a '##' string
    const char* text_display_end;
    if (hide_text_after_hash)
    {
        text_display_end = FindRenderedTextEnd(text, text_end);
    }
    else
    {
        if (!text_end)
            text_end = text + strlen(text); // FIXME-OPT
        text_display_end = text_end;
    }

    const int text_len = (int)(text_display_end - text);
    if (text_len > 0)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end);
        if (g.LogEnabled)
            LogRenderedText(pos, text, text_display_end);
    }
}